

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void rw::Frame::syncDirty(void)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  byte hierarchyFlags;
  long *plVar4;
  long *plVar5;
  
  plVar4 = (long *)(engine + 0x10);
  plVar5 = *(long **)(engine + 0x10);
  if (*(long **)(engine + 0x10) != plVar4) {
    do {
      plVar1 = (long *)*plVar5;
      hierarchyFlags = *(byte *)((long)plVar5 + -0xd);
      if ((hierarchyFlags & 1) == 0) {
        plVar4 = (long *)plVar5[2];
        while (plVar4 != plVar5 + 2) {
          plVar2 = (long *)*plVar4;
          (*(code *)plVar4[2])(plVar4 + -2);
          plVar4 = plVar2;
        }
        syncObjRecurse((Frame *)plVar5[0x14]);
      }
      else {
        if ((hierarchyFlags & 4) != 0) {
          plVar5[0x12] = plVar5[10];
          plVar5[0x13] = plVar5[0xb];
          plVar5[0x10] = plVar5[8];
          plVar5[0x11] = plVar5[9];
          plVar5[0xe] = plVar5[6];
          plVar5[0xf] = plVar5[7];
          plVar5[0xc] = plVar5[4];
          plVar5[0xd] = plVar5[5];
        }
        plVar4 = (long *)plVar5[2];
        if ((long *)plVar5[2] != plVar5 + 2) {
          do {
            plVar2 = (long *)*plVar4;
            (*(code *)plVar4[2])(plVar4 + -2);
            plVar4 = plVar2;
          } while (plVar2 != plVar5 + 2);
          hierarchyFlags = *(byte *)((long)plVar5 + -0xd);
        }
        syncRecurse((Frame *)plVar5[0x14],hierarchyFlags);
      }
      *(byte *)((long)plVar5 + -0xd) = *(byte *)((long)plVar5 + -0xd) & 0xf0;
      plVar4 = (long *)(engine + 0x10);
      plVar5 = plVar1;
    } while (plVar1 != plVar4);
  }
  lVar3 = engine;
  *(long *)(engine + 0x10) = engine + 0x10;
  *(long **)(lVar3 + 0x18) = plVar4;
  return;
}

Assistant:

void
Frame::syncDirty(void)
{
	Frame *frame;
	FORLIST(lnk, engine->frameDirtyList){
		frame = LLLinkGetData(lnk, Frame, inDirtyList);
		if(frame->object.privateFlags & Frame::HIERARCHYSYNCLTM){
			// Sync root's LTM
			if(frame->object.privateFlags & Frame::SUBTREESYNCLTM)
				frame->ltm = frame->matrix;
			// Synch attached objects
			FORLIST(lnk, frame->objectList)
				ObjectWithFrame::fromFrame(lnk)->sync();
			// ...and children
			syncRecurse(frame->child, frame->object.privateFlags);
		}else{
			// LTMs are clean, just synch objects
			FORLIST(lnk, frame->objectList)
				ObjectWithFrame::fromFrame(lnk)->sync();
			syncObjRecurse(frame->child);
		}
		// all clean now
		frame->object.privateFlags &= ~(Frame::SYNCLTM | Frame::SYNCOBJ);
	}
	engine->frameDirtyList.init();
}